

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O2

tuple<std::shared_ptr<pstack::Elf::Object>,_unsigned_long,_Elf64_Sym> * __thiscall
pstack::Procman::Process::resolveSymbolDetail
          (tuple<std::shared_ptr<pstack::Elf::Object>,_unsigned_long,_Elf64_Sym>
           *__return_storage_ptr__,Process *this,char *name,bool includeDebug,
          function<bool_(std::basic_string_view<char,_std::char_traits<char>_>)> *match)

{
  ostringstream *poVar1;
  tuple<std::shared_ptr<pstack::Elf::Object>,_unsigned_long,_Elf64_Sym> *ptVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  Exception *pEVar5;
  undefined7 in_register_00000009;
  _Rb_tree_node_base *p_Var6;
  basic_string_view<char,_std::char_traits<char>_> __args;
  Exception local_260;
  allocator<char> local_c0 [32];
  undefined1 local_a0 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  _Rb_tree_node_base *local_70;
  Process *local_68;
  tuple<std::shared_ptr<pstack::Elf::Object>,_unsigned_long,_Elf64_Sym> *local_60;
  undefined1 local_58 [8];
  sptr obj;
  allocator<char> local_31;
  
  obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (undefined4)CONCAT71(in_register_00000009,includeDebug);
  p_Var4 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_70 = p_Var6;
  local_68 = this;
  local_60 = __return_storage_ptr__;
  do {
    if (p_Var4 == p_Var6) {
      pEVar5 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset(&local_260,0,0x1a0);
      Exception::Exception(&local_260);
      poVar1 = &local_260.str;
      std::operator<<((ostream *)poVar1,"symbol ");
      std::operator<<((ostream *)poVar1,name);
      std::operator<<((ostream *)poVar1," not found");
      Exception::Exception(pEVar5,&local_260);
      __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
    }
    __args._M_str = (char *)p_Var4[1]._M_parent;
    __args._M_len = (size_t)p_Var4[1]._M_left;
    bVar3 = std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                      (match,__args);
    if (bVar3) {
      MappedObject::object((MappedObject *)local_58,(Context *)&p_Var4[1]._M_parent);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,name,local_c0);
      pstack::Elf::Object::findDynamicSymbol((string *)&local_260);
      std::__cxx11::string::~string((string *)local_a0);
      if (local_260._6_2_ != 0) {
        pEVar5 = &local_260;
LAB_001379b8:
        ptVar2 = local_60;
        std::tuple<std::shared_ptr<pstack::Elf::Object>,_unsigned_long,_Elf64_Sym>::
        tuple<std::shared_ptr<pstack::Elf::Object>_&,_const_unsigned_long_&,_Elf64_Sym_&,_true,_true>
                  (local_60,(shared_ptr<pstack::Elf::Object> *)local_58,
                   (unsigned_long *)(p_Var4 + 1),(type *)pEVar5);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&obj);
        return ptVar2;
      }
      if (obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_1_ != '\0') {
        MappedObject::object((MappedObject *)(local_a0 + 0x20),(Context *)&p_Var4[1]._M_parent);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_c0,name,&local_31);
        pstack::Elf::Object::findDebugSymbol((string *)local_a0);
        std::__cxx11::string::~string((string *)local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
        if (local_a0._6_2_ != 0) {
          pEVar5 = (Exception *)local_a0;
          goto LAB_001379b8;
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&obj);
      p_Var6 = local_70;
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

std::tuple<Elf::Object::sptr, Elf::Addr, Elf::Sym>
Process::resolveSymbolDetail(const char *name, bool includeDebug,
        std::function<bool(std::string_view)> match)
{
    for (auto &loaded : objects) {
        if (!match(loaded.second.name()))
           continue;
        auto obj = loaded.second.object(context);
        auto [sym,idx] = obj->findDynamicSymbol(name);
        if (sym.st_shndx != SHN_UNDEF)
           return std::make_tuple(obj, loaded.first, sym);
        if (includeDebug) {
           auto [sym, idx] = loaded.second.object(context)->findDebugSymbol(name);
           if (sym.st_shndx != SHN_UNDEF)
              return std::make_tuple(obj, loaded.first, sym);
        }
    }
    throw (Exception() << "symbol " << name << " not found");
}